

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O3

MppMetaImpl * __thiscall MppMetaService::get_meta(MppMetaService *this,char *tag,char *caller)

{
  RK_U32 *pRVar1;
  RK_U32 RVar2;
  list_head *plVar3;
  undefined1 auVar4 [16];
  MppMetaImpl *__dest;
  long lVar5;
  char *pcVar6;
  list_head *plVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar9;
  
  __dest = (MppMetaImpl *)mpp_osal_malloc("get_meta",0x318);
  if (__dest == (MppMetaImpl *)0x0) {
    _mpp_log_l(2,"mpp_meta","failed to malloc meta data\n","get_meta");
  }
  else {
    pcVar6 = "mpp_meta";
    if (tag != (char *)0x0) {
      pcVar6 = tag;
    }
    strncpy((char *)__dest,pcVar6,0x1f);
    __dest->caller = caller;
    LOCK();
    pRVar1 = &this->meta_id;
    RVar2 = *pRVar1;
    *pRVar1 = *pRVar1 + 1;
    UNLOCK();
    __dest->meta_id = RVar2;
    plVar7 = &__dest->list_meta;
    (__dest->list_meta).next = plVar7;
    (__dest->list_meta).prev = plVar7;
    __dest->ref_count = 1;
    __dest->node_count = 0;
    auVar4 = _DAT_00277a10;
    lVar5 = 0x78;
    auVar8 = _DAT_002788f0;
    auVar10 = _DAT_00277a00;
    do {
      auVar11 = auVar10 ^ auVar4;
      if (auVar11._4_4_ == -0x80000000 && auVar11._0_4_ < -0x7fffffd3) {
        pcVar6 = __dest->tag + lVar5 + -0x30;
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
        pcVar6 = __dest->tag + lVar5 + -0x20;
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
      }
      auVar11 = auVar8 ^ auVar4;
      if (auVar11._4_4_ == -0x80000000 && auVar11._0_4_ < -0x7fffffd3) {
        pcVar6 = __dest->tag + lVar5 + -0x10;
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
        pcVar6 = __dest->tag + lVar5;
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
      }
      lVar9 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar9 + 4;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar9 + 4;
      lVar5 = lVar5 + 0x40;
    } while (lVar5 != 0x378);
    mpp_spinlock_lock(&this->mLock);
    plVar3 = (this->mlist_meta).prev;
    (this->mlist_meta).prev = plVar7;
    (__dest->list_meta).next = &this->mlist_meta;
    (__dest->list_meta).prev = plVar3;
    plVar3->next = plVar7;
    mpp_spinlock_unlock(&this->mLock);
    LOCK();
    this->meta_count = this->meta_count + 1;
    UNLOCK();
  }
  return __dest;
}

Assistant:

MppMetaImpl *MppMetaService::get_meta(const char *tag, const char *caller)
{
    MppMetaImpl *impl = mpp_malloc_size(MppMetaImpl, sizeof(MppMetaImpl) +
                                        sizeof(MppMetaVal) * MPP_ARRAY_ELEMS(meta_defs));
    if (impl) {
        const char *tag_src = (tag) ? (tag) : (MODULE_TAG);
        RK_U32 i;

        strncpy(impl->tag, tag_src, sizeof(impl->tag) - 1);
        impl->caller = caller;
        impl->meta_id = MPP_FETCH_ADD(&meta_id, 1);
        INIT_LIST_HEAD(&impl->list_meta);
        impl->ref_count = 1;
        impl->node_count = 0;

        for (i = 0; i < MPP_ARRAY_ELEMS(meta_defs); i++)
            impl->vals[i].state = 0;

        mpp_spinlock_lock(&mLock);
        list_add_tail(&impl->list_meta, &mlist_meta);
        mpp_spinlock_unlock(&mLock);
        MPP_FETCH_ADD(&meta_count, 1);
    } else {
        mpp_err_f("failed to malloc meta data\n");
    }
    return impl;
}